

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListIteratorTest_rbegin_rend_backward_Test::TestBody
          (IntrusiveListIteratorTest_rbegin_rend_backward_Test *this)

{
  IntrusiveListIteratorTest *pIVar1;
  undefined8 *puVar2;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar3;
  TestObject *pTVar4;
  vector<int,_std::allocator<int>_> *expected;
  TestObject *pTVar5;
  AssertionResult gtest_ar;
  Message local_90;
  undefined1 local_88 [8];
  TestObject *pTStack_80;
  TestObject *local_78;
  unsigned_long local_68;
  IntrusiveListIteratorTest_rbegin_rend_backward_Test *local_60;
  AssertHelper local_58;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_50
  ;
  TestObjectList *local_40;
  undefined8 local_38;
  
  pTVar5 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_60 = this;
  puVar2 = (undefined8 *)operator_new(0xc);
  *puVar2 = &DAT_200000001;
  *(undefined4 *)(puVar2 + 1) = 3;
  local_68 = 0;
  if (pTVar5 != (TestObject *)0x0) {
    pIVar1 = &local_60->super_IntrusiveListIteratorTest;
    do {
      pTVar5 = (pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      pTVar4 = pTVar5;
      if (pTVar5 == (TestObject *)0x0) {
        pTVar4 = (TestObject *)&pIVar1->list_;
      }
      if (((TestObjectList *)pTVar4)->last_ == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                      ,0x9e,
                      "pointer wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator->() const [T = (anonymous namespace)::TestObject]"
                     );
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"expected[count]","last->data",
                 (int *)((long)puVar2 + local_68 * 4),&((TestObjectList *)pTVar4)->last_->data);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message(&local_90);
        if (pTStack_80 == (TestObject *)0x0) {
          pTVar5 = (TestObject *)0x1f4141;
        }
        else {
          pTVar5 = (pTStack_80->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
                   ,0xad,(char *)pTVar5);
        testing::internal::AssertHelper::operator=(&local_58,&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_90.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_90.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        if (pTStack_80 != (TestObject *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pTStack_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pTStack_80);
        }
        goto LAB_0014c5aa;
      }
      if (pTStack_80 != (TestObject *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pTStack_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTStack_80
                    );
      }
      local_68 = local_68 + 1;
    } while (pTVar5 != (TestObject *)0x0);
  }
  local_90.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_88,"count","expected.size()",&local_68,(unsigned_long *)&local_90);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message(&local_90);
    if (pTStack_80 == (TestObject *)0x0) {
      pTVar5 = (TestObject *)0x1f4141;
    }
    else {
      pTVar5 = (pTStack_80->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
               ,0xb0,(char *)pTVar5);
    testing::internal::AssertHelper::operator=(&local_58,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_90.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_90.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (pTStack_80 != (TestObject *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pTStack_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTStack_80);
  }
LAB_0014c5aa:
  operator_delete(puVar2,0xc);
  local_50.current.list_ = (local_60->super_IntrusiveListIteratorTest).clist_;
  expected = (vector<int,_std::allocator<int>_> *)0x0;
  local_38 = 0;
  local_50.current.node_ = (local_50.current.list_)->first_;
  local_78 = (TestObject *)0x0;
  local_88 = (undefined1  [8])0x0;
  pTStack_80 = (TestObject *)0x0;
  local_40 = local_50.current.list_;
  piVar3 = (intrusive_list<(anonymous_namespace)::TestObject> *)operator_new(0xc);
  pTStack_80 = (TestObject *)((long)&piVar3->last_ + 4);
  piVar3->first_ = (TestObject *)&DAT_200000001;
  *(undefined4 *)&piVar3->last_ = 3;
  local_88 = (undefined1  [8])piVar3;
  local_78 = pTStack_80;
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_40,&local_50,
             (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
              *)local_88,expected);
  operator_delete(piVar3,0xc);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, rbegin_rend_backward) {
  TestBackward(list_.rbegin(), list_.rend(), {1, 2, 3});
  TestBackward(clist_.rbegin(), clist_.rend(), {1, 2, 3});
}